

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall
QFileSystemModelPrivate::removeVisibleFile
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,int vLocation)

{
  bool bVar1;
  QFileSystemNode *pQVar2;
  long i;
  int in_EDX;
  long in_RSI;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  bool indexHidden;
  QFileSystemModel *q;
  QModelIndex parent;
  undefined8 in_stack_ffffffffffffff98;
  int row;
  QFileSystemNode *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined1 local_20 [16];
  undefined1 *local_10;
  long local_8;
  
  row = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QFileSystemNode *)q_func(in_RDI);
  if (in_EDX != -1) {
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    index((QFileSystemModelPrivate *)local_20,(char *)in_RDI,(int)in_RSI);
    bVar1 = isHiddenByFilter(in_RDI,(QFileSystemNode *)
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (QModelIndex *)in_stack_ffffffffffffffa0);
    if (!bVar1) {
      in_stack_ffffffffffffffac =
           translateVisibleLocation
                     ((QFileSystemModelPrivate *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),pQVar2,row);
      translateVisibleLocation
                ((QFileSystemModelPrivate *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),pQVar2,row);
      QAbstractItemModel::beginRemoveRows
                ((QModelIndex *)pQVar2,(int)local_20,in_stack_ffffffffffffffac);
      in_stack_ffffffffffffffa0 = pQVar2;
    }
    i = in_RSI + 0x18;
    QList<QString>::at((QList<QString> *)in_stack_ffffffffffffffa0,i);
    pQVar2 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                       ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        &in_stack_ffffffffffffffa0->fileName);
    pQVar2->isVisible = false;
    QList<QString>::removeAt((QList<QString> *)in_stack_ffffffffffffffa0,i);
    if (!bVar1) {
      QAbstractItemModel::endRemoveRows();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModelPrivate::removeVisibleFile(QFileSystemNode *parentNode, int vLocation)
{
    Q_Q(QFileSystemModel);
    if (vLocation == -1)
        return;
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);
    if (!indexHidden)
        q->beginRemoveRows(parent, translateVisibleLocation(parentNode, vLocation),
                                       translateVisibleLocation(parentNode, vLocation));
    parentNode->children.value(parentNode->visibleChildren.at(vLocation))->isVisible = false;
    parentNode->visibleChildren.removeAt(vLocation);
    if (!indexHidden)
        q->endRemoveRows();
}